

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileParser::copyNextWord(ObjFileParser *this,char *pBuffer,size_t length)

{
  char *pcVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  byte *pbVar7;
  
  pcVar5 = (this->m_DataIt)._M_current;
  pcVar3 = (this->m_DataItEnd)._M_current;
  pcVar1 = pcVar3 + -1;
  if (pcVar1 != pcVar5 && pcVar5 != pcVar3) {
    do {
      if (((*pcVar5 != ' ') && (*pcVar5 != '\t')) || (pcVar5 = pcVar5 + 1, pcVar5 == pcVar3)) break;
    } while (pcVar5 != pcVar1);
  }
  (this->m_DataIt)._M_current = pcVar5;
  if (*pcVar5 == '\\') {
    pcVar5 = pcVar5 + 2;
    (this->m_DataIt)._M_current = pcVar5;
    if (pcVar1 != pcVar5 && pcVar5 != pcVar3) {
      while ((*pcVar5 == ' ' || (*pcVar5 == '\t'))) {
        pcVar5 = pcVar5 + 1;
        if ((pcVar5 == pcVar3) || (pcVar5 == pcVar1)) break;
      }
    }
    (this->m_DataIt)._M_current = pcVar5;
  }
  pbVar7 = (byte *)(this->m_DataIt)._M_current;
  if (pbVar7 == (byte *)(this->m_DataItEnd)._M_current) {
    uVar6 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      bVar2 = *pbVar7;
      if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
      goto LAB_00485f5a;
      pBuffer[uVar6] = bVar2;
      if (length - 2 == uVar6) break;
      pbVar7 = (byte *)((this->m_DataIt)._M_current + 1);
      (this->m_DataIt)._M_current = (char *)pbVar7;
      uVar4 = uVar6 + 1;
    } while (pbVar7 != (byte *)(this->m_DataItEnd)._M_current);
    uVar6 = uVar6 + 1;
  }
LAB_00485f5a:
  if (uVar6 < length) {
    pBuffer[uVar6] = '\0';
    return;
  }
  __assert_fail("index < length",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileParser.cpp"
                ,0x104,"void Assimp::ObjFileParser::copyNextWord(char *, size_t)");
}

Assistant:

void ObjFileParser::copyNextWord(char *pBuffer, size_t length) {
    size_t index = 0;
    m_DataIt = getNextWord<DataArrayIt>(m_DataIt, m_DataItEnd);
    if ( *m_DataIt == '\\' ) {
        ++m_DataIt;
        ++m_DataIt;
        m_DataIt = getNextWord<DataArrayIt>( m_DataIt, m_DataItEnd );
    }
    while( m_DataIt != m_DataItEnd && !IsSpaceOrNewLine( *m_DataIt ) ) {
        pBuffer[index] = *m_DataIt;
        index++;
        if( index == length - 1 ) {
            break;
        }
        ++m_DataIt;
    }

    ai_assert(index < length);
    pBuffer[index] = '\0';
}